

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Expression * __thiscall hdc::Parser::parse_primary_expression(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  ParenthesisExpression *this_00;
  DolarExpression *this_01;
  Expression *pEVar3;
  AtExpression *this_02;
  IdentifierExpression *expression_00;
  LiteralIntegerExpression *this_03;
  LiteralCharExpression *this_04;
  LiteralFloatExpression *this_05;
  LiteralDoubleExpression *this_06;
  LiteralStringExpression *this_07;
  LiteralSymbolExpression *this_08;
  LiteralNullExpression *this_09;
  LiteralBoolExpression *pLVar4;
  reference pTVar5;
  Token local_280;
  undefined1 local_249;
  Token local_248;
  undefined1 local_211;
  Token local_210;
  undefined1 local_1d9;
  Token local_1d8;
  undefined1 local_1a1;
  Token local_1a0;
  undefined1 local_169;
  Token local_168;
  undefined1 local_131;
  Token local_130;
  undefined1 local_f9;
  Token local_f8;
  undefined1 local_c1;
  Token local_c0;
  undefined1 local_8a;
  undefined1 local_89;
  Token local_88;
  undefined1 local_48 [8];
  Token oper;
  Expression *expression;
  Parser *this_local;
  
  oper._40_8_ = 0;
  Token::Token((Token *)local_48);
  bVar2 = match(this,TK_LEFT_PARENTHESIS);
  if (bVar2) {
    pTVar5 = __gnu_cxx::
             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
             ::operator*(&this->matched);
    Token::operator=((Token *)local_48,pTVar5);
    this_00 = (ParenthesisExpression *)operator_new(0x60);
    pEVar3 = parse_expression(this);
    ParenthesisExpression::ParenthesisExpression(this_00,(Token *)local_48,pEVar3);
    oper._40_8_ = this_00;
    expect(this,TK_RIGHT_PARENTHESIS);
  }
  else {
    bVar2 = match(this,TK_DOLAR);
    if (bVar2) {
      pTVar5 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      Token::operator=((Token *)local_48,pTVar5);
      expect(this,TK_LITERAL_STRING);
      this_01 = (DolarExpression *)operator_new(0x60);
      local_8a = 1;
      pEVar3 = (Expression *)operator_new(0x58);
      local_89 = 1;
      pTVar5 = __gnu_cxx::
               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
               ::operator*(&this->matched);
      Token::Token(&local_88,pTVar5);
      LiteralStringExpression::LiteralStringExpression((LiteralStringExpression *)pEVar3,&local_88);
      local_89 = 0;
      DolarExpression::DolarExpression(this_01,(Token *)local_48,pEVar3);
      local_8a = 0;
      oper._40_8_ = this_01;
      Token::~Token(&local_88);
    }
    else {
      bVar2 = match(this,TK_AT);
      if (bVar2) {
        pTVar5 = __gnu_cxx::
                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                 ::operator*(&this->matched);
        Token::operator=((Token *)local_48,pTVar5);
        this_02 = (AtExpression *)operator_new(0x60);
        expression_00 = parse_identifier_expression(this);
        AtExpression::AtExpression(this_02,(Token *)local_48,&expression_00->super_Expression);
        oper._40_8_ = this_02;
      }
      else {
        bVar2 = match(this,TK_LITERAL_INTEGER);
        if (bVar2) {
          this_03 = (LiteralIntegerExpression *)operator_new(0x58);
          local_c1 = 1;
          pTVar5 = __gnu_cxx::
                   __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                   ::operator*(&this->matched);
          Token::Token(&local_c0,pTVar5);
          LiteralIntegerExpression::LiteralIntegerExpression(this_03,&local_c0);
          local_c1 = 0;
          oper._40_8_ = this_03;
          Token::~Token(&local_c0);
        }
        else {
          bVar2 = match(this,TK_LITERAL_CHAR);
          if (bVar2) {
            this_04 = (LiteralCharExpression *)operator_new(0x58);
            local_f9 = 1;
            pTVar5 = __gnu_cxx::
                     __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                     ::operator*(&this->matched);
            Token::Token(&local_f8,pTVar5);
            LiteralCharExpression::LiteralCharExpression(this_04,&local_f8);
            local_f9 = 0;
            oper._40_8_ = this_04;
            Token::~Token(&local_f8);
          }
          else {
            bVar2 = match(this,TK_LITERAL_FLOAT);
            if (bVar2) {
              this_05 = (LiteralFloatExpression *)operator_new(0x58);
              local_131 = 1;
              pTVar5 = __gnu_cxx::
                       __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                       ::operator*(&this->matched);
              Token::Token(&local_130,pTVar5);
              LiteralFloatExpression::LiteralFloatExpression(this_05,&local_130);
              local_131 = 0;
              oper._40_8_ = this_05;
              Token::~Token(&local_130);
            }
            else {
              bVar2 = match(this,TK_LITERAL_DOUBLE);
              if (bVar2) {
                this_06 = (LiteralDoubleExpression *)operator_new(0x58);
                local_169 = 1;
                pTVar5 = __gnu_cxx::
                         __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                         ::operator*(&this->matched);
                Token::Token(&local_168,pTVar5);
                LiteralDoubleExpression::LiteralDoubleExpression(this_06,&local_168);
                local_169 = 0;
                oper._40_8_ = this_06;
                Token::~Token(&local_168);
              }
              else {
                bVar2 = match(this,TK_LITERAL_STRING);
                if (bVar2) {
                  this_07 = (LiteralStringExpression *)operator_new(0x58);
                  local_1a1 = 1;
                  pTVar5 = __gnu_cxx::
                           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                           ::operator*(&this->matched);
                  Token::Token(&local_1a0,pTVar5);
                  LiteralStringExpression::LiteralStringExpression(this_07,&local_1a0);
                  local_1a1 = 0;
                  oper._40_8_ = this_07;
                  Token::~Token(&local_1a0);
                }
                else {
                  bVar2 = match(this,TK_LITERAL_SYMBOL);
                  if (bVar2) {
                    this_08 = (LiteralSymbolExpression *)operator_new(0x58);
                    local_1d9 = 1;
                    pTVar5 = __gnu_cxx::
                             __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                             ::operator*(&this->matched);
                    Token::Token(&local_1d8,pTVar5);
                    LiteralSymbolExpression::LiteralSymbolExpression(this_08,&local_1d8);
                    local_1d9 = 0;
                    oper._40_8_ = this_08;
                    Token::~Token(&local_1d8);
                  }
                  else {
                    bVar2 = match(this,TK_NULL);
                    if (bVar2) {
                      this_09 = (LiteralNullExpression *)operator_new(0x58);
                      local_211 = 1;
                      pTVar5 = __gnu_cxx::
                               __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                               ::operator*(&this->matched);
                      Token::Token(&local_210,pTVar5);
                      LiteralNullExpression::LiteralNullExpression(this_09,&local_210);
                      local_211 = 0;
                      oper._40_8_ = this_09;
                      Token::~Token(&local_210);
                    }
                    else {
                      bVar2 = match(this,TK_TRUE);
                      if (bVar2) {
                        pLVar4 = (LiteralBoolExpression *)operator_new(0x58);
                        local_249 = 1;
                        pTVar5 = __gnu_cxx::
                                 __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                 ::operator*(&this->matched);
                        Token::Token(&local_248,pTVar5);
                        LiteralBoolExpression::LiteralBoolExpression(pLVar4,&local_248);
                        local_249 = 0;
                        oper._40_8_ = pLVar4;
                        Token::~Token(&local_248);
                      }
                      else {
                        bVar2 = match(this,TK_FALSE);
                        if (bVar2) {
                          pLVar4 = (LiteralBoolExpression *)operator_new(0x58);
                          pTVar5 = __gnu_cxx::
                                   __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>
                                   ::operator*(&this->matched);
                          Token::Token(&local_280,pTVar5);
                          LiteralBoolExpression::LiteralBoolExpression(pLVar4,&local_280);
                          oper._40_8_ = pLVar4;
                          Token::~Token(&local_280);
                        }
                        else {
                          bVar2 = lookahead(this,TK_LEFT_SQUARE_BRACKET);
                          if (bVar2) {
                            oper._40_8_ = parse_list_expression(this);
                          }
                          else {
                            bVar2 = lookahead(this,TK_LEFT_CURLY_BRACKET);
                            if (bVar2) {
                              oper._40_8_ = parse_array_expression(this);
                            }
                            else {
                              oper._40_8_ = parse_identifier_expression(this);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  uVar1 = oper._40_8_;
  Token::~Token((Token *)local_48);
  return (Expression *)uVar1;
}

Assistant:

Expression* Parser::parse_primary_expression() {
    Expression* expression = NULL;
    Token oper;

    if (match(TK_LEFT_PARENTHESIS)) {
        oper = *matched;
        expression = new ParenthesisExpression(oper, parse_expression());
        expect(TK_RIGHT_PARENTHESIS);
    } else if (match(TK_DOLAR)) {
        oper = *matched;

        expect(TK_LITERAL_STRING);
        expression = new DolarExpression(oper, new LiteralStringExpression(*matched));
    } else if (match(TK_AT)) {
        oper = *matched;
        expression = new AtExpression(oper, parse_identifier_expression());
    } else if (match(TK_LITERAL_INTEGER)) {
        expression = new LiteralIntegerExpression(*matched);
    } else if (match(TK_LITERAL_CHAR)) {
        expression = new LiteralCharExpression(*matched);
    } else if (match(TK_LITERAL_FLOAT)) {
        expression = new LiteralFloatExpression(*matched);
    } else if (match(TK_LITERAL_DOUBLE)) {
        expression = new LiteralDoubleExpression(*matched);
    } else if (match(TK_LITERAL_STRING)) {
        expression = new LiteralStringExpression(*matched);
    } else if (match(TK_LITERAL_SYMBOL)) {
        expression = new LiteralSymbolExpression(*matched);
    } else if (match(TK_NULL)) {
        expression = new LiteralNullExpression(*matched);
    } else if (match(TK_TRUE)) {
        expression = new LiteralBoolExpression(*matched);
    } else if (match(TK_FALSE)) {
        expression = new LiteralBoolExpression(*matched);
    } else if (lookahead(TK_LEFT_SQUARE_BRACKET)) {
        expression = parse_list_expression();
    } else if (lookahead(TK_LEFT_CURLY_BRACKET)) {
        expression = parse_array_expression();
    } else {
        expression = parse_identifier_expression();
    }

    return expression; 
}